

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLuint GVar8;
  time_t tVar9;
  GLFWwindow *handle;
  GLchar *pGVar10;
  GLchar *pGVar11;
  GLchar *pGVar12;
  size_t sVar13;
  int i;
  long lVar14;
  long lVar15;
  GLuint cursor;
  GLfloat delta_time;
  GLchar *fragCode;
  GLchar *vertCode;
  vec2 current_cursor;
  GLchar *computeCode;
  GLuint vel;
  GLuint timebuffer;
  GLuint pos;
  GLuint vao;
  GLchar infolog [512];
  vec4 positions [100000];
  vec4 velocities [100000];
  GLuint in_stack_ffffffffffcf2978;
  GLuint in_stack_ffffffffffcf29b8;
  GLuint in_stack_ffffffffffcf29bc;
  GLuint in_stack_ffffffffffcf29c0;
  GLuint in_stack_ffffffffffcf29c4;
  
  lVar15 = 0;
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  handle = glfwCreateWindow(0x780,0x438,"particles",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  glfwMakeContextCurrent(handle);
  glfwSwapInterval(1);
  gladLoadGL();
  memset(&stack0xffffffffffcf2bc8,0,1600000);
  memset(&stack0xffffffffffe795c8,0,1600000);
  lVar14 = 0;
  do {
    iVar4 = rand();
    dVar1 = (double)((float)iVar4 * 4.656613e-10 * 8.0);
    dVar2 = sin((double)(int)lVar14);
    dVar3 = cos((double)(int)lVar14);
    *(float *)(&stack0xffffffffffcf2bc8 + lVar15) = (float)((dVar2 * dVar1) / 10.0);
    *(float *)(&stack0xffffffffffcf2bcc + lVar15) = (float)((dVar3 * dVar1) / 10.0);
    *(undefined8 *)(&stack0xffffffffffcf2bd0 + lVar15) = 0;
    lVar14 = lVar14 + 1;
    *(undefined8 *)(&stack0xffffffffffe795c8 + lVar15) = 0;
    *(undefined8 *)(&stack0xffffffffffe795d0 + lVar15) = 0;
    lVar15 = lVar15 + 0x10;
  } while (lVar14 != 100000);
  (*glad_glCreateVertexArrays)(1,(GLuint *)&stack0xffffffffffcf29c4);
  (*glad_glBindVertexArray)(in_stack_ffffffffffcf29c4);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf29c0);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf29bc);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf29b8);
  (*glad_glCreateBuffers)(1,(GLuint *)&stack0xffffffffffcf2978);
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf29b8,1600000,&stack0xffffffffffe795c8,0x88e4);
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf29c0,1600000,&stack0xffffffffffcf2bc8,0x88e4);
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf29bc,4,&stack0xffffffffffcf297c,0x88e8);
  (*glad_glNamedBufferData)(in_stack_ffffffffffcf2978,8,&defaultCursor,0x88e8);
  (*glad_glBindBufferBase)(0x90d2,0,in_stack_ffffffffffcf29c0);
  (*glad_glBindBufferBase)(0x90d2,1,in_stack_ffffffffffcf29b8);
  (*glad_glBindBufferBase)(0x90d2,2,in_stack_ffffffffffcf2978);
  (*glad_glBindBufferBase)(0x90d2,3,in_stack_ffffffffffcf29bc);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffcf29c8,"shader.vert","");
  pGVar10 = LoadShader((string *)&stack0xffffffffffcf29c8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffcf29c8,"shader.frag","");
  pGVar11 = LoadShader((string *)&stack0xffffffffffcf29c8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffcf29c8,"cursor.glsl","");
  pGVar12 = LoadShader((string *)&stack0xffffffffffcf29c8);
  GVar5 = (*glad_glCreateShader)(0x8b31);
  GVar6 = (*glad_glCreateShader)(0x8b30);
  GVar7 = (*glad_glCreateShader)(0x91b9);
  (*glad_glShaderSource)(GVar5,1,(GLchar **)&stack0xffffffffffcf2998,(GLint *)0x0);
  (*glad_glShaderSource)(GVar6,1,(GLchar **)&stack0xffffffffffcf2990,(GLint *)0x0);
  (*glad_glShaderSource)(GVar7,1,(GLchar **)&stack0xffffffffffcf29b0,(GLint *)0x0);
  (*glad_glCompileShader)(GVar5);
  (*glad_glGetShaderInfoLog)(GVar5,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar13 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  (*glad_glCompileShader)(GVar6);
  (*glad_glGetShaderInfoLog)(GVar6,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar13 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  (*glad_glCompileShader)(GVar7);
  (*glad_glGetShaderInfoLog)(GVar7,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar13 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  GVar8 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar8,GVar5);
  (*glad_glAttachShader)(GVar8,GVar6);
  (*glad_glLinkProgram)(GVar8);
  (*glad_glDeleteShader)(GVar5);
  (*glad_glDeleteShader)(GVar6);
  (*glad_glGetProgramInfoLog)(GVar8,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar13 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  GVar5 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar5,GVar7);
  (*glad_glLinkProgram)(GVar5);
  (*glad_glDeleteShader)(GVar7);
  (*glad_glGetProgramInfoLog)(GVar5,0x200,(GLsizei *)0x0,&stack0xffffffffffcf29c8);
  sVar13 = strlen(&stack0xffffffffffcf29c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,&stack0xffffffffffcf29c8,sVar13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  (*glad_glViewport)(0,0,0x780,0x438);
  (*glad_glClearColor)(0.05,0.05,0.05,1.0);
  (*glad_glPointSize)(2.0);
  iVar4 = glfwWindowShouldClose(handle);
  while (iVar4 == 0) {
    (*glad_glClear)(0x4000);
    glfwPollEvents();
    glfwGetCursorPos(handle,(double *)&stack0xffffffffffcf2988,(double *)&stack0xffffffffffcf2980);
    (*glad_glNamedBufferSubData)(in_stack_ffffffffffcf2978,0,8,&stack0xffffffffffcf29a0);
    (*glad_glUseProgram)(GVar5);
    (*glad_glDispatchCompute)(100,1,1);
    (*glad_glUseProgram)(GVar8);
    (*glad_glDrawArraysInstanced)(0,0,1,100000);
    glfwSwapBuffers(handle);
    iVar4 = glfwWindowShouldClose(handle);
  }
  (*glad_glDeleteProgram)(GVar8);
  (*glad_glDeleteProgram)(GVar5);
  if (pGVar10 != (GLchar *)0x0) {
    operator_delete__(pGVar10);
  }
  if (pGVar11 != (GLchar *)0x0) {
    operator_delete__(pGVar11);
  }
  if (pGVar12 != (GLchar *)0x0) {
    operator_delete__(pGVar12);
  }
  glfwDestroyWindow(handle);
  glfwTerminate();
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  srand(time(0));

  const GLfloat delta_time = 0.1f;

  //Window Setup
  glfwInit();

  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);

  GLFWwindow* window = glfwCreateWindow(SCREENX, SCREENY, "particles", nullptr, nullptr);
  glfwMakeContextCurrent(window);
  glfwSwapInterval(1);

  gladLoadGL();

  //Setup Initial Positions/Velocities
  glm::vec4 positions[NUM_PARTICLES];
  glm::vec4 velocities[NUM_PARTICLES];
  for(int i = 0; i < NUM_PARTICLES; i++) {
    float r = (float)rand() / RAND_MAX;
    r *= 8;
    float velx = r * sin(i) / 10;
    float vely = r * cos(i) / 10;
    positions[i] = glm::vec4(velx, vely, 0.0f, 0.0f);
    velocities[i] = glm::vec4(0.0f, 0.0f, 0.0f, 0.0f);
  }

  GLuint vao, pos, timebuffer, vel, cursor;

  /**
  * VAO Setup - Even though we'll be sourcing all of our positions from a shader storage buffer,
  * a VAO must be bound for drawing, so let's just create an empty one. We also don't need a VBO
  * since all our rendering will be points
  */
  glCreateVertexArrays(1, &vao);
  glBindVertexArray(vao);

  /**
  * Buffer setup - We'll need 4 SSBOs, one for the position of each point, one for velocity,
  * one for cursor position, and one for delta_time. As cursor and delta_time are small, these
  * could have been implemented using regular uniforms, but I opted for consistency instead
  */
  glCreateBuffers(1, &pos);
  glCreateBuffers(1, &timebuffer);
  glCreateBuffers(1, &vel);
  glCreateBuffers(1, &cursor);
  glNamedBufferData(vel, sizeof(velocities), velocities, GL_STATIC_DRAW);
  glNamedBufferData(pos, sizeof(positions), positions, GL_STATIC_DRAW);
  glNamedBufferData(timebuffer, sizeof(GLfloat), &delta_time, GL_DYNAMIC_DRAW);
  glNamedBufferData(cursor, 2 * sizeof(GLfloat), glm::value_ptr(defaultCursor), GL_DYNAMIC_DRAW);

  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, pos);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, vel);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, cursor);
  glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, timebuffer);


  /*
  * Basic Shader Setup - This is standard shader loading and compilation. The only difference is that the compute
  * shader must be linked by itself in a separate program
  */
  const GLchar* vertCode = LoadShader("shader.vert");
  const GLchar* fragCode = LoadShader("shader.frag");
  const GLchar* computeCode = LoadShader("cursor.glsl");

  GLuint vertShader = glCreateShader(GL_VERTEX_SHADER);
  GLuint fragShader = glCreateShader(GL_FRAGMENT_SHADER);
  GLuint computeShader = glCreateShader(GL_COMPUTE_SHADER);

  glShaderSource(vertShader, 1, &vertCode, nullptr);
  glShaderSource(fragShader, 1, &fragCode, nullptr);
  glShaderSource(computeShader, 1, &computeCode, nullptr);
  GLchar infolog[512];
  glCompileShader(vertShader);
  glGetShaderInfoLog(vertShader, 512, nullptr, infolog);

  std::cout << infolog << std::endl;

  glCompileShader(fragShader);
  glGetShaderInfoLog(fragShader, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  glCompileShader(computeShader);
  glGetShaderInfoLog(computeShader, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  GLuint shaderProgram = glCreateProgram();
  glAttachShader(shaderProgram, vertShader);
  glAttachShader(shaderProgram, fragShader);
  glLinkProgram(shaderProgram);
  glDeleteShader(vertShader);
  glDeleteShader(fragShader);

  glGetProgramInfoLog(shaderProgram, 512, nullptr, infolog);

  std::cout << infolog << std::endl;

  GLuint computeProgram = glCreateProgram();
  glAttachShader(computeProgram, computeShader);
  glLinkProgram(computeProgram);
  glDeleteShader(computeShader);

  glGetProgramInfoLog(computeProgram, 512, nullptr, infolog);
  std::cout << infolog << std::endl;

  /**
  * Setup some basic properties for screen size, background color and point size
  * 2.0 Point Size was used to make it easier to see
  */
  glViewport(0, 0, SCREENX, SCREENY);
  glClearColor(0.05f, 0.05, 0.05f, 1.0f);
  glPointSize(2.0f);

  // Draw Loop
  while(glfwWindowShouldClose(window) == 0) {
    glClear(GL_COLOR_BUFFER_BIT);
    /**
    * Get our cursor coordinates in normalized device coordinates
    */
    glfwPollEvents();
    double cursorx;
    double cursory;
    glfwGetCursorPos(window, &cursorx, &cursory);

    cursorx = cursorx - (SCREENX / 2);
    cursorx /= SCREENX;
    cursorx *= 2;

    cursory = cursory - (SCREENY / 2);
    cursory /= SCREENY;
    cursory *= -2;

    /**
    * Copy over the cursor position into the buffer
    */
    glm::vec2 current_cursor = glm::vec2(cursorx, cursory);

    glNamedBufferSubData(cursor, 0, 2 * sizeof(GLfloat), glm::value_ptr(current_cursor));

    /**
    * Fire off our compute shader run. Since we want to simulate 100000 particles, and our work group size is 1000
    * we need to dispatch 100 work groups
    */
    glUseProgram(computeProgram);
    glDispatchCompute(NUM_PARTICLES / WORK_GROUP_SIZE, 1, 1);

    /**
    * Draw the particles
    */
    glUseProgram(shaderProgram);
    glDrawArraysInstanced(GL_POINTS, 0, 1, NUM_PARTICLES);


    glfwSwapBuffers(window);
  }

  /**
  * We're done now, just need to free up our resources
  */

  //OpenGL Shutdown
  glDeleteProgram(shaderProgram);
  glDeleteProgram(computeProgram);
  delete[] vertCode;
  delete[] fragCode;
  delete[] computeCode;

  //Window Shutdown
  glfwDestroyWindow(window);
  glfwTerminate();
  return 0;
}